

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_compressionParameters cParams_00;
  uint uVar1;
  ZSTD_CDict *cdict;
  size_t sVar2;
  void *ptr;
  
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    cdict = (ZSTD_CDict *)ZSTD_malloc(0x1300,customMem);
    sVar2 = ZSTD_sizeof_matchState(&cParams,0);
    ptr = ZSTD_malloc(sVar2 + 0x1800,customMem);
    if (cdict == (ZSTD_CDict *)0x0 || ptr == (void *)0x0) {
      ZSTD_free(cdict,customMem);
      ZSTD_free(ptr,customMem);
    }
    else {
      (cdict->customMem).opaque = customMem.opaque;
      (cdict->customMem).customAlloc = customMem.customAlloc;
      (cdict->customMem).customFree = customMem.customFree;
      cdict->workspace = ptr;
      cdict->workspaceSize = sVar2 + 0x1800;
      cParams_00.hashLog = cParams.hashLog;
      cParams_00.windowLog = cParams.windowLog;
      cParams_00.chainLog = cParams.chainLog;
      cParams_00.searchLog = cParams.searchLog;
      cParams_00.searchLength = cParams.searchLength;
      cParams_00.targetLength = cParams.targetLength;
      cParams_00.strategy = cParams.strategy;
      sVar2 = ZSTD_initCDict_internal
                        (cdict,dictBuffer,dictSize,dictLoadMethod,dictContentType,cParams_00);
      uVar1 = ZSTD_isError(sVar2);
      if (uVar1 == 0) {
        return cdict;
      }
      ZSTD_freeCDict(cdict);
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams, ZSTD_customMem customMem)
{
    DEBUGLOG(3, "ZSTD_createCDict_advanced, mode %u", (U32)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   ZSTD_CDict* const cdict = (ZSTD_CDict*)ZSTD_malloc(sizeof(ZSTD_CDict), customMem);
        size_t const workspaceSize = HUF_WORKSPACE_SIZE + ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
        void* const workspace = ZSTD_malloc(workspaceSize, customMem);

        if (!cdict || !workspace) {
            ZSTD_free(cdict, customMem);
            ZSTD_free(workspace, customMem);
            return NULL;
        }
        cdict->customMem = customMem;
        cdict->workspace = workspace;
        cdict->workspaceSize = workspaceSize;
        if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                        dictBuffer, dictSize,
                                        dictLoadMethod, dictContentType,
                                        cParams) )) {
            ZSTD_freeCDict(cdict);
            return NULL;
        }

        return cdict;
    }
}